

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvolutionFilter.cpp
# Opt level: O2

void __thiscall
Rml::ConvolutionFilter::Run
          (ConvolutionFilter *this,byte *destination,Vector2i destination_dimensions,
          int destination_stride,ColorFormat destination_color_format,byte *source,
          Vector2i source_dimensions,Vector2i source_offset,ColorFormat source_color_format)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  float *pfVar14;
  int kernel_x;
  ulong uVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  ulong local_b0;
  
  uVar16 = (ulong)destination_dimensions >> 0x20;
  iVar6 = ((this->kernel_size).x + -1) / -2;
  iVar4 = ((this->kernel_size).y + -1) / -2 - source_offset.y;
  uVar11 = 0;
  if (0 < destination_dimensions.x) {
    uVar11 = (ulong)destination_dimensions & 0xffffffff;
  }
  if (destination_dimensions.y == 0 || (long)destination_dimensions < 0) {
    uVar16 = 0;
  }
  local_b0 = (ulong)(uint)((source_dimensions.x * iVar4 + iVar6) - source_offset.x);
  for (uVar7 = 0; uVar7 != uVar16; uVar7 = uVar7 + 1) {
    uVar13 = local_b0;
    iVar5 = iVar6 - source_offset.x;
    for (uVar9 = 0; uVar9 != uVar11; uVar9 = uVar9 + 1) {
      uVar2 = (this->kernel_size).y;
      uVar3 = (this->kernel_size).x;
      pfVar14 = (this->kernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
                .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                super__Head_base<0UL,_float_*,_false>._M_head_impl;
      uVar8 = 0;
      if (0 < (int)uVar3) {
        uVar8 = (ulong)uVar3;
      }
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      fVar17 = 0.0;
      uVar12 = uVar13;
      for (uVar10 = 0; uVar10 != uVar2; uVar10 = uVar10 + 1) {
        lVar1 = uVar10 + (long)(iVar4 + (int)uVar7);
        for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
          if ((((-1 < lVar1) && (lVar1 < (long)source_dimensions >> 0x20)) &&
              (-1 < (long)((long)iVar5 + uVar15))) &&
             ((long)((long)iVar5 + uVar15) < (long)source_dimensions.x)) {
            fVar18 = (float)source[(ulong)(uint)((int)uVar12 + (int)uVar15 <<
                                                (source_color_format == RGBA8) * '\x02') +
                                   (ulong)((uint)(source_color_format == RGBA8) * 3)] *
                     pfVar14[uVar15];
            if (this->operation == Dilation) {
              if (fVar17 <= fVar18) {
                fVar17 = fVar18;
              }
            }
            else if (this->operation == Sum) {
              fVar17 = fVar17 + fVar18;
            }
          }
        }
        pfVar14 = pfVar14 + (int)uVar3;
        uVar12 = uVar12 + (long)source_dimensions;
      }
      fVar18 = 255.0;
      if (fVar17 <= 255.0) {
        fVar18 = fVar17;
      }
      destination
      [(int)(((int)uVar9 << (destination_color_format == RGBA8) * '\x02') +
            (int)uVar7 * destination_stride + (uint)(destination_color_format == RGBA8) * 3)] =
           (byte)(int)fVar18;
      iVar5 = iVar5 + 1;
      uVar13 = uVar13 + 1;
    }
    local_b0 = local_b0 + (long)source_dimensions;
  }
  return;
}

Assistant:

void ConvolutionFilter::Run(byte* destination, const Vector2i destination_dimensions, const int destination_stride,
	const ColorFormat destination_color_format, const byte* source, const Vector2i source_dimensions, const Vector2i source_offset,
	const ColorFormat source_color_format) const
{
	RMLUI_ZoneScopedNC("ConvFilter::Run", 0xd6bf49);

	const int destination_bytes_per_pixel = (destination_color_format == ColorFormat::RGBA8 ? 4 : 1);
	const int destination_alpha_offset = (destination_color_format == ColorFormat::RGBA8 ? 3 : 0);
	const int source_bytes_per_pixel = (source_color_format == ColorFormat::RGBA8 ? 4 : 1);
	const int source_alpha_offset = (source_color_format == ColorFormat::RGBA8 ? 3 : 0);

	const Vector2i kernel_radius = (kernel_size - Vector2i(1)) / 2;

	for (int y = 0; y < destination_dimensions.y; ++y)
	{
		for (int x = 0; x < destination_dimensions.x; ++x)
		{
			float opacity = 0.f;

			for (int kernel_y = 0; kernel_y < kernel_size.y; ++kernel_y)
			{
				const int source_y = y - source_offset.y - kernel_radius.y + kernel_y;

				for (int kernel_x = 0; kernel_x < kernel_size.x; ++kernel_x)
				{
					const int source_x = x - source_offset.x - kernel_radius.x + kernel_x;
					if (source_y >= 0 && source_y < source_dimensions.y && source_x >= 0 && source_x < source_dimensions.x)
					{
						const int source_index = (source_y * source_dimensions.x + source_x) * source_bytes_per_pixel + source_alpha_offset;
						const float pixel_opacity = float(source[source_index]) * kernel[kernel_y * kernel_size.x + kernel_x];

						switch (operation)
						{
						case FilterOperation::Sum: opacity += pixel_opacity; break;
						case FilterOperation::Dilation: opacity = Math::Max(opacity, pixel_opacity); break;
						}
					}
				}
			}

			opacity = Math::Min(255.f, opacity);

			const int destination_index = y * destination_stride + x * destination_bytes_per_pixel + destination_alpha_offset;
			destination[destination_index] = byte(opacity);
		}
	}
}